

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffdtdm(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,long *naxes,int *status)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  tcolumn *ptVar4;
  long lVar5;
  char message [81];
  char *local_98;
  tcolumn *local_90;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (colnum == 0) {
    ptVar4 = (tcolumn *)0x0;
  }
  else {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
      *status = 0x12e;
      return 0x12e;
    }
    ptVar4 = fptr->Fptr->tableptr;
    if (*tdimstr == '\0') {
      *naxis = 1;
      if (0 < maxdim) {
        *naxes = ptVar4[(ulong)(uint)colnum - 1].trepeat;
      }
      return *status;
    }
    ptVar4 = ptVar4 + ((ulong)(uint)colnum - 1);
  }
  *naxis = 0;
  local_98 = strchr(tdimstr,0x28);
  if (local_98 == (char *)0x0) {
    snprintf(local_88,0x51,"Illegal dimensions format: %s",tdimstr);
    *status = 0x107;
  }
  else {
    lVar5 = 1;
    local_90 = ptVar4;
    do {
      local_98 = local_98 + 1;
      lVar2 = strtol(local_98,&local_98,10);
      pcVar3 = local_98;
      iVar1 = *naxis;
      if (iVar1 < maxdim) {
        naxes[iVar1] = lVar2;
      }
      if (lVar2 < 0) {
        ffpmsg("one or more dimension are less than 0 (ffdtdm)");
        ffpmsg(tdimstr);
        goto LAB_001b3bde;
      }
      lVar5 = lVar5 * lVar2;
      *naxis = iVar1 + 1;
      local_98 = strchr(local_98,0x2c);
    } while (local_98 != (char *)0x0);
    pcVar3 = strchr(pcVar3,0x29);
    if (pcVar3 == (char *)0x0) {
      snprintf(local_88,0x51,"Illegal dimensions format: %s",tdimstr);
LAB_001b3bde:
      *status = 0x107;
    }
    else {
      if (((colnum == 0) || (local_90->tdatatype < 1)) || (local_90->trepeat == lVar5)) {
        return *status;
      }
      snprintf(local_88,0x51,"column vector length, %ld, does not equal TDIMn array size, %ld",
               local_90->trepeat,lVar5);
      ffpmsg(local_88);
      ffpmsg(tdimstr);
      *status = 0x107;
    }
  }
  return 0x107;
}

Assistant:

int ffdtdm(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
  If colnum = 0, then the validity checking is disabled.
*/
{
    long dimsize, totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr = 0;

    if (*status > 0)
        return(*status);

    if (colnum != 0) {
        if (fptr->HDUposition != (fptr->Fptr)->curhdu)
            ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

        if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
            return(*status = BAD_COL_NUM);

        colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
        colptr += (colnum - 1);    /* increment to the correct column */

        if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
        {
            *naxis = 1;                   /* default = 1 dimensional */
            if (maxdim > 0)
                naxes[0] = (long) colptr->trepeat; /* default length = repeat */

            return(*status);
        }
    }

    *naxis = 0;

    loc = strchr(tdimstr, '(' );  /* find the opening quote */
    if (!loc)
    {
            snprintf(message, FLEN_ERRMSG, "Illegal dimensions format: %s", tdimstr);
            return(*status = BAD_TDIM);
    }

    while (loc)
    {
            loc++;
            dimsize = strtol(loc, &loc, 10);  /* read size of next dimension */
            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more dimension are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
    }

    loc = strchr(lastloc, ')' );  /* check for the closing quote */
    if (!loc)
    {
            snprintf(message, FLEN_ERRMSG, "Illegal dimensions format: %s", tdimstr);
            return(*status = BAD_TDIM);
    }

    if (colnum != 0) {
        if ((colptr->tdatatype > 0) && ((long) colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %ld, does not equal TDIMn array size, %ld",
          (long) colptr->trepeat, totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}